

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O2

uint16_t __thiscall basisu::etc_block::get_base5_color(etc_block *this)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  uVar1 = (this->field_0).m_uint64;
  auVar2._0_2_ = (ushort)uVar1 >> 3;
  auVar2._2_2_ = (ushort)(uVar1 >> 0x10) >> 3;
  auVar2._4_2_ = (ushort)(uVar1 >> 0x20) >> 3;
  auVar2._6_2_ = (ushort)(uVar1 >> 0x33);
  auVar2._8_8_ = 0;
  auVar2 = pmovzxbw(auVar2 & _DAT_002643f0,auVar2 & _DAT_002643f0);
  auVar3 = psllw(auVar2,10);
  auVar2 = psllw(auVar2,5);
  return auVar3._0_2_ | auVar2._2_2_ | (ushort)((this->field_0).m_bytes[2] >> 3);
}

Assistant:

inline uint32_t get_byte_bits(uint32_t ofs, uint32_t num) const
		{
			assert((ofs + num) <= 64U);
			assert(num && (num <= 8U));
			assert((ofs >> 3) == ((ofs + num - 1) >> 3));
			const uint32_t byte_ofs = 7 - (ofs >> 3);
			const uint32_t byte_bit_ofs = ofs & 7;
			return (m_bytes[byte_ofs] >> byte_bit_ofs) & ((1 << num) - 1);
		}